

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  MemSegment *pMVar1;
  void *pvVar2;
  MmapArena local_288;
  NoActionMemLogger local_278 [8];
  undefined **local_270;
  MmapArena *local_268;
  NoActionMemLogger *local_260;
  MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> local_258;
  
  local_268 = &local_288;
  local_288.m_minSize = 0x10000;
  local_288.m_prot = 3;
  local_288.m_flag = 0x22;
  local_260 = local_278;
  local_258.m_arena = local_268;
  local_258.m_logger = local_260;
  memset(&local_258.m_footprintLimit,0,0x232);
  local_258.m_paddingByte = -0x33;
  local_270 = &PTR__SimpleMemContext_00105d28;
  pvVar2 = cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_258,100);
  pvVar2 = cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::reallocate
                     (&local_258,pvVar2,1000);
  cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::deallocate
            (&local_258,pvVar2,0);
  local_270 = &PTR__MemContext_00105da0;
  while (local_258.m_segList != (MemSegment *)0x0) {
    pMVar1 = (local_258.m_segList)->m_next;
    munmap(local_258.m_segList,(local_258.m_segList)->m_size);
    local_258.m_segList = pMVar1;
  }
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    // Use default arena
    cookmem::SimpleMemContext<cookmem::MmapArena> memCtx;

    // allocate memory
    void* ptr = memCtx.allocate (100);

    // change the size of the memory
    ptr = memCtx.reallocate (ptr, 1000);

    // free the memory
    memCtx.deallocate (ptr);

    return 0;
}